

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialogPrivate::showHeader(QFileDialogPrivate *this,QAction *action)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  byte bVar4;
  long lVar5;
  QHeaderView *this_00;
  long lVar6;
  int iVar7;
  long in_FS_OFFSET;
  QArrayData *local_40;
  long local_38;
  long local_30;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::sender();
  lVar5 = QMetaObject::cast((QObject *)&QActionGroup::staticMetaObject);
  this_00 = QTreeView::header(&((this->qFileDialogUi).d)->treeView->super_QTreeView);
  QActionGroup::actions();
  if (local_30 != 0) {
    lVar6 = -8;
    do {
      iVar7 = (int)lVar5;
      lVar1 = local_30 * -8 + lVar6;
      if (lVar1 == -8) goto LAB_004f315f;
      lVar5 = lVar6 + 8;
      plVar2 = (long *)(local_38 + 8 + lVar6);
      lVar6 = lVar5;
    } while ((QAction *)*plVar2 != action);
    iVar7 = (int)(lVar5 >> 3);
LAB_004f315f:
    if (lVar1 != -8) goto LAB_004f316c;
  }
  iVar7 = -1;
LAB_004f316c:
  bVar4 = QAction::isChecked();
  QHeaderView::setSectionHidden(this_00,iVar7 + 1,(bool)(bVar4 ^ 1));
  if (local_40 != (QArrayData *)0x0) {
    LOCK();
    (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::showHeader(QAction *action)
{
    Q_Q(QFileDialog);
    QActionGroup *actionGroup = qobject_cast<QActionGroup*>(q->sender());
    qFileDialogUi->treeView->header()->setSectionHidden(int(actionGroup->actions().indexOf(action) + 1),
                                                        !action->isChecked());
}